

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::sortTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                 *__return_storage_ptr__,IConfig *config,
                vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                *unsortedTestCases)

{
  pointer *ppTVar1;
  pointer pTVar2;
  size_type sVar3;
  iterator __position;
  long lVar4;
  ITestInvoker *pIVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *randomized;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  *__range3;
  size_type sVar10;
  _Alloc_hider _Var11;
  uint uVar12;
  uint uVar13;
  TestCaseHandle *__args;
  TestCaseHandle *pTVar14;
  TestCaseHandle *handle;
  pointer pTVar15;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  indexed_tests;
  string local_78;
  ReusableStringStream local_50;
  SourceLineInfo local_40;
  
  iVar6 = (*config->_vptr_IConfig[0x10])(config);
  if (iVar6 == 2) {
    seedRng(config);
    rng();
    uVar12 = (uint)(rng::s_rng.m_state >> 0x2d) ^ (uint)(rng::s_rng.m_state >> 0x1b);
    bVar8 = (byte)(rng::s_rng.m_state >> 0x3b);
    uVar7 = rng::s_rng.m_state * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
    uVar13 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
    bVar9 = (byte)(uVar7 >> 0x3b);
    rng::s_rng.m_state = uVar7 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::reserve((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               *)&local_78,
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4);
    pTVar15 = (unsortedTestCases->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (unsortedTestCases->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar15 != pTVar2) {
      uVar7 = CONCAT44(uVar12 >> bVar8 | uVar12 << 0x20 - bVar8,
                       uVar13 >> bVar9 | uVar13 << 0x20 - bVar9);
      do {
        sVar3 = (pTVar15->m_info->name)._M_string_length;
        local_50.m_index = uVar7;
        if (sVar3 != 0) {
          sVar10 = 0;
          do {
            local_50.m_index =
                 ((long)(pTVar15->m_info->name)._M_dataplus._M_p[sVar10] ^ local_50.m_index) *
                 0x100000001b3;
            sVar10 = sVar10 + 1;
          } while (sVar3 != sVar10);
        }
        std::
        vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
        ::emplace_back<unsigned_long,Catch::TestCaseHandle_const&>
                  ((vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
                    *)&local_78,&local_50.m_index,pTVar15);
        pTVar15 = pTVar15 + 1;
      } while (pTVar15 != pTVar2);
    }
    sVar3 = local_78._M_string_length;
    _Var11._M_p = local_78._M_dataplus._M_p;
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      uVar7 = ((long)(local_78._M_string_length - (long)local_78._M_dataplus._M_p) >> 3) *
              -0x5555555555555555;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_78._M_dataplus._M_p,local_78._M_string_length,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e
                );
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (_Var11._M_p,sVar3);
      _Var11._M_p = (pointer)local_78._M_string_length;
    }
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
              (__return_storage_ptr__,
               ((long)_Var11._M_p - (long)local_78._M_dataplus._M_p >> 3) * -0x5555555555555555);
    sVar3 = local_78._M_string_length;
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      __args = (TestCaseHandle *)(local_78._M_dataplus._M_p + 8);
      do {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
          _M_realloc_insert<Catch::TestCaseHandle_const&>
                    ((vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>> *)
                     __return_storage_ptr__,__position,__args);
        }
        else {
          pIVar5 = __args->m_invoker;
          (__position._M_current)->m_info = __args->m_info;
          (__position._M_current)->m_invoker = pIVar5;
          ppTVar1 = &(__return_storage_ptr__->
                     super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        pTVar14 = __args + 1;
        __args = (TestCaseHandle *)&__args[1].m_invoker;
      } while (pTVar14 != (TestCaseHandle *)sVar3);
    }
    if ((TestCaseHandle *)local_78._M_dataplus._M_p != (TestCaseHandle *)0x0) {
      operator_delete(local_78._M_dataplus._M_p,
                      local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
    }
  }
  else if (iVar6 == 1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    pTVar15 = (__return_storage_ptr__->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (__return_storage_ptr__->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar15 != pTVar2) {
      uVar7 = (long)pTVar2 - (long)pTVar15 >> 4;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pTVar15,pTVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pTVar15,pTVar2);
    }
  }
  else {
    if (iVar6 != 0) {
      ReusableStringStream::ReusableStringStream(&local_50);
      local_40.file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
      ;
      local_40.line = 0x149c;
      operator<<(local_50.m_oss,&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_50.m_oss,": Internal Catch2 error: ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_50.m_oss,"Unknown test order value!",0x19);
      std::__cxx11::stringbuf::str();
      throw_logic_error(&local_78);
    }
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCaseHandle> sortTests(IConfig const &config, std::vector<TestCaseHandle> const &unsortedTestCases) {
        switch (config.runOrder()) {
        case TestRunOrder::Declared:
            return unsortedTestCases;

        case TestRunOrder::LexicographicallySorted: {
            std::vector<TestCaseHandle> sorted = unsortedTestCases;
            std::sort(sorted.begin(), sorted.end());
            return sorted;
        }
        case TestRunOrder::Randomized: {
            seedRng(config);
            HashTest h(rng());
            std::vector<std::pair<uint64_t, TestCaseHandle>> indexed_tests;
            indexed_tests.reserve(unsortedTestCases.size());

            for (auto const &handle : unsortedTestCases) {
                indexed_tests.emplace_back(h(handle.getTestCaseInfo()), handle);
            }

            std::sort(indexed_tests.begin(), indexed_tests.end());

            std::vector<TestCaseHandle> randomized;
            randomized.reserve(indexed_tests.size());

            for (auto const &indexed : indexed_tests) {
                randomized.push_back(indexed.second);
            }

            return randomized;
        }
        }

        CATCH_INTERNAL_ERROR("Unknown test order value!");
    }